

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.h
# Opt level: O0

void __thiscall
CNetAddr::SerializeV2Stream<ParamsStream<VectorWriter&,CNetAddr::SerParams>>
          (CNetAddr *this,ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *s)

{
  long lVar1;
  bool bVar2;
  ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *in_RSI;
  CNetAddr *in_RDI;
  long in_FS_OFFSET;
  CNetAddr *in_stack_ffffffffffffffb8;
  CNetAddr *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = IsInternal(in_stack_ffffffffffffffb8);
  if (bVar2) {
    ParamsStream<VectorWriter&,CNetAddr::SerParams>::operator<<
              ((ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RDI,
               (uchar *)in_stack_ffffffffffffffc0);
    Using<CompactSizeFormatter<true>,unsigned_long_const&>((unsigned_long *)in_RSI);
    ParamsStream<VectorWriter&,CNetAddr::SerParams>::operator<<
              ((ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RDI,
               (Wrapper<CompactSizeFormatter<true>,_const_unsigned_long_&> *)in_RSI);
    SerializeV1Stream<ParamsStream<VectorWriter&,CNetAddr::SerParams>>(in_RDI,in_RSI);
  }
  else {
    GetBIP155Network(in_stack_ffffffffffffffc0);
    ParamsStream<VectorWriter&,CNetAddr::SerParams>::operator<<
              ((ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RDI,
               (uchar *)in_stack_ffffffffffffffc0);
    ParamsStream<VectorWriter&,CNetAddr::SerParams>::operator<<
              ((ParamsStream<VectorWriter_&,_CNetAddr::SerParams> *)in_RDI,
               &in_stack_ffffffffffffffc0->m_addr);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeV2Stream(Stream& s) const
    {
        if (IsInternal()) {
            // Serialize NET_INTERNAL as embedded in IPv6. We need to
            // serialize such addresses from addrman.
            s << static_cast<uint8_t>(BIP155Network::IPV6);
            s << COMPACTSIZE(ADDR_IPV6_SIZE);
            SerializeV1Stream(s);
            return;
        }

        s << static_cast<uint8_t>(GetBIP155Network());
        s << m_addr;
    }